

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemDecTiger.cpp
# Opt level: O2

void __thiscall ProblemDecTiger::FillTransitionModel(ProblemDecTiger *this)

{
  TransitionModelDiscrete *pTVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  Index s2;
  ulong uVar5;
  Index ja;
  
  uVar2 = *(ulong *)&(this->super_DecPOMDPDiscrete).field_0x220;
  for (uVar4 = 0; uVar4 < uVar2; uVar4 = (ulong)((int)uVar4 + 1)) {
    for (uVar5 = 0; uVar5 < uVar2; uVar5 = (ulong)((int)uVar5 + 1)) {
      uVar2 = 0;
      while( true ) {
        uVar3 = (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                       super_MultiAgentDecisionProcessDiscrete.
                                       super_MultiAgentDecisionProcess + 0x70))(this);
        if (uVar3 <= uVar2) break;
        pTVar1 = (this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_p_tModel;
        (*(pTVar1->super_TransitionModelDiscreteInterface).super_TransitionModel.
          _vptr_TransitionModel[5])(0x3fe0000000000000,pTVar1,uVar4,uVar2,uVar5);
        uVar2 = (ulong)((int)uVar2 + 1);
      }
      uVar2 = *(ulong *)&(this->super_DecPOMDPDiscrete).field_0x220;
    }
  }
  pTVar1 = (this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_p_tModel;
  (*(pTVar1->super_TransitionModelDiscreteInterface).super_TransitionModel._vptr_TransitionModel[5])
            (0x3ff0000000000000,pTVar1,0,0,0);
  pTVar1 = (this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_p_tModel;
  (*(pTVar1->super_TransitionModelDiscreteInterface).super_TransitionModel._vptr_TransitionModel[5])
            (0,pTVar1,0,0,1);
  pTVar1 = (this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_p_tModel;
  (*(pTVar1->super_TransitionModelDiscreteInterface).super_TransitionModel._vptr_TransitionModel[5])
            (0x3ff0000000000000,pTVar1,1,0,1);
  pTVar1 = (this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_p_tModel;
  (*(pTVar1->super_TransitionModelDiscreteInterface).super_TransitionModel._vptr_TransitionModel[5])
            (0,pTVar1,1,0,0);
  return;
}

Assistant:

void ProblemDecTiger::FillTransitionModel()
{
    // add transitions:
    for(Index s1=0; s1<NUMBER_OF_STATES;s1++) 
        for(Index s2=0; s2<NUMBER_OF_STATES;s2++) 
            for(Index ja=0; ja<GetNrJointActions(); ja++)
            {
                if(DEBUG_TM)    cout << "ProblemDecTiger::FillTransitionModel() - calling SetTransitionProbability("<<s1<<", "<<ja<<", "<<s2<<", 0.5)"<<endl;
                SetTransitionProbability(s1, ja, s2, 0.5);
        
                if(DEBUG_TM)    cout << " - GetTransitionProb gives " << GetTransitionProbability(s1, ja, s2) << endl;
            }
    SetTransitionProbability(SLEFT, LISTEN_LISTEN, SLEFT, 1.0);
    SetTransitionProbability(SLEFT, LISTEN_LISTEN, SRIGHT, 0.0);
    SetTransitionProbability(SRIGHT, LISTEN_LISTEN, SRIGHT, 1.0);
    SetTransitionProbability(SRIGHT, LISTEN_LISTEN, SLEFT, 0.0);
}